

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

void conv_fmt_8bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                    int src_stridec,int *dst_stride,int uv_shift)

{
  int iVar1;
  int iVar2;
  uchar *local_48;
  uchar *pdst;
  uchar *psrc;
  int local_30;
  int j;
  int i;
  int src_stride_local;
  int height_local;
  int width_local;
  uchar **dst_local;
  uchar *src_uv_local;
  uchar *src_y_local;
  
  local_48 = *dst;
  pdst = src_y;
  for (local_30 = 0; local_30 < height; local_30 = local_30 + 1) {
    memcpy(local_48,pdst,(long)width);
    pdst = pdst + src_stride;
    local_48 = local_48 + *dst_stride;
  }
  iVar1 = width >> ((byte)uv_shift & 0x1f);
  iVar2 = height >> ((byte)uv_shift & 0x1f);
  local_48 = dst[1];
  pdst = src_uv;
  for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
    for (psrc._4_4_ = 0; psrc._4_4_ < iVar1; psrc._4_4_ = psrc._4_4_ + 1) {
      local_48[psrc._4_4_] = pdst[psrc._4_4_ << 1];
    }
    pdst = pdst + src_stridec;
    local_48 = local_48 + dst_stride[1];
  }
  pdst = src_uv + 1;
  local_48 = dst[2];
  for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
    for (psrc._4_4_ = 0; psrc._4_4_ < iVar1; psrc._4_4_ = psrc._4_4_ + 1) {
      local_48[psrc._4_4_] = pdst[psrc._4_4_ << 1];
    }
    pdst = pdst + src_stridec;
    local_48 = local_48 + dst_stride[2];
  }
  return;
}

Assistant:

static void conv_fmt_8bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    unsigned char* psrc = src_y;
    unsigned char* pdst = dst[0];
    for (i = 0; i < height; i++) {
        memcpy(pdst, psrc, width);
        psrc += src_stride;
        pdst += dst_stride[0];
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = src_uv;
    pdst = dst[1];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += src_stridec;
        pdst += dst_stride[1];
    }

    psrc = src_uv + 1;
    pdst = dst[2];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += src_stridec;
        pdst += dst_stride[2];
    }
}